

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O0

uint8_t * ChunkEmitSpecial(WebPChunk *header,size_t total_size,uint8_t *dst)

{
  size_t __n;
  size_t sVar1;
  WebPChunk *in_RDX;
  long in_RDI;
  size_t offset_to_next;
  size_t header_size;
  uint32_t in_stack_ffffffffffffffcc;
  uint8_t *in_stack_ffffffffffffffd0;
  
  __n = *(size_t *)(in_RDI + 0x10);
  PutLE32(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  PutLE32(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  memcpy(&in_RDX->data_,*(void **)(in_RDI + 8),__n);
  if ((__n & 1) != 0) {
    *(undefined1 *)((long)&(in_RDX->data_).bytes + __n) = 0;
  }
  sVar1 = ChunkDiskSize(in_RDX);
  return (uint8_t *)((long)&in_RDX->tag_ + sVar1);
}

Assistant:

static uint8_t* ChunkEmitSpecial(const WebPChunk* const header,
                                 size_t total_size, uint8_t* dst) {
  const size_t header_size = header->data_.size;
  const size_t offset_to_next = total_size - CHUNK_HEADER_SIZE;
  assert(header->tag_ == kChunks[IDX_ANMF].tag);
  PutLE32(dst + 0, header->tag_);
  PutLE32(dst + TAG_SIZE, (uint32_t)offset_to_next);
  assert(header_size == (uint32_t)header_size);
  memcpy(dst + CHUNK_HEADER_SIZE, header->data_.bytes, header_size);
  if (header_size & 1) {
    dst[CHUNK_HEADER_SIZE + header_size] = 0;  // Add padding.
  }
  return dst + ChunkDiskSize(header);
}